

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O0

void __thiscall
iDynTree::InverseKinematics::setRotationParametrization
          (InverseKinematics *this,InverseKinematicsRotationParametrization parametrization)

{
  missingIpoptErrorReport();
  return;
}

Assistant:

void InverseKinematics::setRotationParametrization(enum InverseKinematicsRotationParametrization parametrization)
    {
#ifdef IDYNTREE_USES_IPOPT
        assert(m_pimpl);
        IK_PIMPL(m_pimpl)->setRotationParametrization(parametrization);
#else
        missingIpoptErrorReport();
#endif
    }